

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3IndexAffinityStr(sqlite3 *db,Index *pIdx)

{
  short sVar1;
  char cVar2;
  void *pvVar3;
  long in_RSI;
  sqlite3 *in_RDI;
  char aff;
  i16 x;
  Table *pTab;
  int n;
  Expr *in_stack_ffffffffffffffc8;
  undefined5 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd5;
  undefined2 in_stack_ffffffffffffffd6;
  sqlite3 *db_00;
  int local_1c;
  
  if (*(long *)(in_RSI + 0x20) == 0) {
    db_00 = *(sqlite3 **)(in_RSI + 0x18);
    pvVar3 = sqlite3DbMallocRaw(db_00,CONCAT26(in_stack_ffffffffffffffd6,
                                               CONCAT15(in_stack_ffffffffffffffd5,
                                                        in_stack_ffffffffffffffd0)));
    *(void **)(in_RSI + 0x20) = pvVar3;
    if (*(long *)(in_RSI + 0x20) == 0) {
      sqlite3OomFault(in_RDI);
      return (char *)0x0;
    }
    for (local_1c = 0; local_1c < (int)(uint)*(ushort *)(in_RSI + 0x60); local_1c = local_1c + 1) {
      sVar1 = *(short *)(*(long *)(in_RSI + 8) + (long)local_1c * 2);
      if (sVar1 < 0) {
        if (sVar1 == -1) {
          *(undefined1 *)(*(long *)(in_RSI + 0x20) + (long)local_1c) = 0x44;
        }
        else {
          cVar2 = sqlite3ExprAffinity(in_stack_ffffffffffffffc8);
          if (cVar2 == '\0') {
            cVar2 = 'A';
          }
          *(char *)(*(long *)(in_RSI + 0x20) + (long)local_1c) = cVar2;
        }
      }
      else {
        *(undefined1 *)(*(long *)(in_RSI + 0x20) + (long)local_1c) =
             *(undefined1 *)((long)&db_00->pVdbe->pParse + (long)sVar1 * 0x20 + 1);
      }
    }
    *(undefined1 *)(*(long *)(in_RSI + 0x20) + (long)local_1c) = 0;
  }
  return *(char **)(in_RSI + 0x20);
}

Assistant:

SQLITE_PRIVATE const char *sqlite3IndexAffinityStr(sqlite3 *db, Index *pIdx){
  if( !pIdx->zColAff ){
    /* The first time a column affinity string for a particular index is
    ** required, it is allocated and populated here. It is then stored as
    ** a member of the Index structure for subsequent use.
    **
    ** The column affinity string will eventually be deleted by
    ** sqliteDeleteIndex() when the Index structure itself is cleaned
    ** up.
    */
    int n;
    Table *pTab = pIdx->pTable;
    pIdx->zColAff = (char *)sqlite3DbMallocRaw(0, pIdx->nColumn+1);
    if( !pIdx->zColAff ){
      sqlite3OomFault(db);
      return 0;
    }
    for(n=0; n<pIdx->nColumn; n++){
      i16 x = pIdx->aiColumn[n];
      if( x>=0 ){
        pIdx->zColAff[n] = pTab->aCol[x].affinity;
      }else if( x==XN_ROWID ){
        pIdx->zColAff[n] = SQLITE_AFF_INTEGER;
      }else{
        char aff;
        assert( x==XN_EXPR );
        assert( pIdx->aColExpr!=0 );
        aff = sqlite3ExprAffinity(pIdx->aColExpr->a[n].pExpr);
        if( aff==0 ) aff = SQLITE_AFF_BLOB;
        pIdx->zColAff[n] = aff;
      }
    }
    pIdx->zColAff[n] = 0;
  }
 
  return pIdx->zColAff;
}